

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conn.c
# Opt level: O0

int conn_recv(conn_handle *conn,uint8_t *buff,size_t buff_len)

{
  void *pvVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  int local_34;
  int bytes_read;
  int ret;
  conn_priv *priv;
  size_t buff_len_local;
  uint8_t *buff_local;
  conn_handle *conn_local;
  
  pvVar1 = conn->priv;
  local_34 = 0;
  if (conn->type == CONN_TYPE_TCP) {
    mutex_lock_shared((mutex_handle *)((long)pvVar1 + 0x90));
    priv = (conn_priv *)buff_len;
    buff_len_local = (size_t)buff;
    if (*(int *)((long)pvVar1 + 8) == -1) {
      local_34 = -0x6b;
    }
    else {
      for (; priv != (conn_priv *)0x0; priv = (conn_priv *)((long)priv - (long)iVar2)) {
        sVar3 = recvfrom(*(int *)((long)pvVar1 + 8),(void *)buff_len_local,(ulong)priv & 0xffffffff,
                         0,(sockaddr *)0x0,(socklen_t *)0x0);
        iVar2 = (int)sVar3;
        if (iVar2 == 0) {
          local_34 = -0x20;
          break;
        }
        if (iVar2 == -1) {
          piVar4 = __errno_location();
          local_34 = -*piVar4;
          break;
        }
        buff_len_local = buff_len_local + (long)iVar2;
        local_34 = iVar2 + local_34;
      }
    }
    mutex_unlock_shared((mutex_handle *)((long)pvVar1 + 0x90));
    conn_local._4_4_ = local_34;
  }
  else {
    conn_local._4_4_ = -0x5b;
  }
  return conn_local._4_4_;
}

Assistant:

int conn_recv(struct conn_handle *conn, uint8_t *buff, size_t buff_len)
{
	struct conn_priv *priv = conn->priv;
	int ret = 0;
	int bytes_read = 0;

	if (conn->type != CONN_TYPE_TCP)
		return -EPROTOTYPE;

	mutex_lock_shared(&priv->mutex);

	if (priv->fd == INVALID_SOCKET) {
		ret = -ENOTCONN;

		goto conn_recv_exit;
	}

	while (buff_len > 0) {
		ret = recvfrom(priv->fd, (char *)buff, (socklen_t)buff_len, 0,
			       NULL, NULL);

		if (ret == 0) {
			ret = -EPIPE;

			goto conn_recv_exit;
		} else if (ret == SOCKET_ERROR) {
			ret = SOCK_ERRNO;

#ifdef _WIN32
			if (ret == -WSAESHUTDOWN)
				ret = -EPIPE;

#endif

			goto conn_recv_exit;
		}

		buff_len -= ret;
		buff += ret;
		ret = bytes_read += ret;
	}

conn_recv_exit:
	mutex_unlock_shared(&priv->mutex);

	return ret;
}